

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void save_cpu_state(DisasContext_conflict6 *ctx,int do_save_pc)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGArg a2;
  uint uVar1;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((do_save_pc != 0) && (a2 = (ctx->base).pc_next, a2 != ctx->saved_pc)) {
    tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->cpu_pc + (long)tcg_ctx),a2);
    ctx->saved_pc = (ctx->base).pc_next;
  }
  if (ctx->hflags != ctx->saved_hflags) {
    tcg_gen_op2_mips64el
              (tcg_ctx,INDEX_op_movi_i32,(TCGArg)(tcg_ctx->hflags + (long)tcg_ctx),
               (long)(int)ctx->hflags);
    ctx->saved_hflags = ctx->hflags;
    uVar1 = ctx->hflags & 0x803800;
    if (((uVar1 == 0x800) || (uVar1 == 0x1800)) || (uVar1 == 0x1000)) {
      tcg_gen_op2_mips64el
                (tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->btarget + (long)tcg_ctx),ctx->btarget);
      return;
    }
  }
  return;
}

Assistant:

static inline void save_cpu_state(DisasContext *ctx, int do_save_pc)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    LOG_DISAS("hflags %08x saved %08x\n", ctx->hflags, ctx->saved_hflags);
    if (do_save_pc && ctx->base.pc_next != ctx->saved_pc) {
        gen_save_pc(tcg_ctx, ctx->base.pc_next);
        ctx->saved_pc = ctx->base.pc_next;
    }
    if (ctx->hflags != ctx->saved_hflags) {
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->hflags, ctx->hflags);
        ctx->saved_hflags = ctx->hflags;
        switch (ctx->hflags & MIPS_HFLAG_BMASK_BASE) {
        case MIPS_HFLAG_BR:
            break;
        case MIPS_HFLAG_BC:
        case MIPS_HFLAG_BL:
        case MIPS_HFLAG_B:
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->btarget, ctx->btarget);
            break;
        }
    }
}